

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

vector<hta::Row,_std::allocator<hta::Row>_> *
hta::convert_timevalues_smooth
          (vector<hta::Row,_std::allocator<hta::Row>_> *__return_storage_ptr__,
          vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *raw_tvs,TimePoint begin,
          TimePoint end,Duration interval)

{
  Value VVar1;
  Value maximum;
  double dVar2;
  Aggregate other;
  Aggregate other_00;
  bool bVar3;
  type tVar4;
  size_type sVar5;
  pointer pTVar6;
  time_point *ptVar7;
  type active_time;
  rep rVar8;
  bool local_1a9;
  bool local_191;
  undefined1 auStack_130 [8];
  Aggregate partial_interval;
  type partial_duration;
  Aggregate local_f0;
  undefined1 local_c0 [8];
  Aggregate agg;
  time_point local_88;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_80;
  time_point current_end;
  TimePoint current_begin;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_68;
  time_point previous_tp;
  const_iterator tv_end;
  const_iterator tv_it;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  undefined1 local_31;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *local_30;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *raw_tvs_local;
  Duration interval_local;
  TimePoint end_local;
  TimePoint begin_local;
  vector<hta::Row,_std::allocator<hta::Row>_> *rows;
  
  local_31 = 0;
  local_30 = raw_tvs;
  raw_tvs_local = (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)interval.__r;
  interval_local.__r =
       (rep)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
  end_local = begin;
  std::vector<hta::Row,_std::allocator<hta::Row>_>::vector(__return_storage_ptr__);
  local_40.__r = (rep)std::chrono::operator-
                                ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&interval_local,
                                 &end_local.
                                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                );
  tVar4 = std::chrono::operator/
                    (&local_40,(duration<long,_std::ratio<1L,_1000000000L>_> *)&raw_tvs_local);
  std::vector<hta::Row,_std::allocator<hta::Row>_>::reserve(__return_storage_ptr__,tVar4 + 1);
  sVar5 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::size(local_30);
  if (sVar5 == 0) {
    __assert_fail("raw_tvs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x108,
                  "std::vector<Row> hta::convert_timevalues_smooth(const std::vector<TimeValue> &, TimePoint, TimePoint, Duration)"
                 );
  }
  tv_end = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::begin(local_30);
  previous_tp.
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
       std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::end(local_30);
  pTVar6 = __gnu_cxx::
           __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
           ::operator->(&tv_end);
  ptVar7 = std::min<hta::Clock::time_point>(&end_local,&pTVar6->time);
  local_68.__d.__r =
       (duration)
       (ptVar7->
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>).__d
       .__r;
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&tv_end,(__normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                                *)&previous_tp);
    local_191 = false;
    if (bVar3) {
      pTVar6 = __gnu_cxx::
               __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ::operator->(&tv_end);
      local_191 = std::chrono::operator<
                            ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)pTVar6,
                             &end_local.
                              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            );
    }
    if (local_191 == false) break;
    pTVar6 = __gnu_cxx::
             __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
             ::operator->(&tv_end);
    local_68.__d.__r =
         (duration)
         (pTVar6->time).
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    __gnu_cxx::
    __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
    ::operator++(&tv_end);
  }
  bVar3 = __gnu_cxx::operator==
                    (&tv_end,(__normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                              *)&previous_tp);
  if (!bVar3) {
    current_end.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = end_local.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
    while (bVar3 = std::chrono::operator<
                             (&current_end.
                               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&interval_local), bVar3) {
      pTVar6 = __gnu_cxx::
               __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ::operator->(&tv_end);
      bVar3 = std::chrono::operator>=
                        ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)pTVar6,
                         &current_end.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        );
      if (!bVar3) {
        __assert_fail("tv_it->time >= current_begin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,0x11d,
                      "std::vector<Row> hta::convert_timevalues_smooth(const std::vector<TimeValue> &, TimePoint, TimePoint, Duration)"
                     );
      }
      agg.active_time.__r =
           (rep)std::chrono::operator+
                          (&current_end.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           ,(duration<long,_std::ratio<1L,_1000000000L>_> *)&raw_tvs_local);
      Clock::time_point::time_point(&local_88,(base *)&agg.active_time);
      ptVar7 = std::min<hta::Clock::time_point>(&local_88,(time_point *)&interval_local);
      local_80.__d.__r =
           (duration)
           (ptVar7->
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           .__d.__r;
      Aggregate::Aggregate((Aggregate *)local_c0);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&tv_end,(__normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                                    *)&previous_tp);
        local_1a9 = false;
        if (bVar3) {
          pTVar6 = __gnu_cxx::
                   __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                   ::operator->(&tv_end);
          local_1a9 = std::chrono::operator<
                                ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)pTVar6,&local_80);
        }
        if (local_1a9 == false) break;
        pTVar6 = __gnu_cxx::
                 __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ::operator->(&tv_end);
        VVar1 = pTVar6->value;
        pTVar6 = __gnu_cxx::
                 __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ::operator->(&tv_end);
        active_time = std::chrono::operator-
                                ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)pTVar6,&local_68);
        Aggregate::Aggregate(&local_f0,VVar1,(Duration)active_time.__r);
        other.maximum = local_f0.maximum;
        other.minimum = local_f0.minimum;
        other.sum = local_f0.sum;
        other.count = local_f0.count;
        other.integral = local_f0.integral;
        other.active_time.__r = local_f0.active_time.__r;
        Aggregate::operator+=((Aggregate *)local_c0,other);
        pTVar6 = __gnu_cxx::
                 __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ::operator->(&tv_end);
        local_68.__d.__r =
             (duration)
             (pTVar6->time).
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        __gnu_cxx::
        __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ::operator++(&tv_end);
      }
      bVar3 = __gnu_cxx::operator==
                        (&tv_end,(__normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                                  *)&previous_tp);
      if (bVar3) {
        std::vector<hta::Row,std::allocator<hta::Row>>::
        emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::Clock::time_point&,hta::Aggregate&>
                  ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)&raw_tvs_local,&current_end,
                   (Aggregate *)local_c0);
        return __return_storage_ptr__;
      }
      partial_interval.active_time.__r = (rep)std::chrono::operator-(&local_80,&local_68);
      pTVar6 = __gnu_cxx::
               __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ::operator->(&tv_end);
      VVar1 = pTVar6->value;
      pTVar6 = __gnu_cxx::
               __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ::operator->(&tv_end);
      maximum = pTVar6->value;
      pTVar6 = __gnu_cxx::
               __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ::operator->(&tv_end);
      dVar2 = pTVar6->value;
      rVar8 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                         &partial_interval.active_time);
      Aggregate::Aggregate
                ((Aggregate *)auStack_130,VVar1,maximum,0.0,0,dVar2 * (double)rVar8,
                 &partial_interval.active_time);
      other_00.maximum = partial_interval.minimum;
      other_00.minimum = (Value)auStack_130;
      other_00.sum = partial_interval.maximum;
      other_00.count = (uint64_t)partial_interval.sum;
      other_00.integral = (Value)partial_interval.count;
      other_00.active_time.__r = (rep)partial_interval.integral;
      Aggregate::operator+=((Aggregate *)local_c0,other_00);
      local_68.__d.__r = local_80.__d.__r;
      std::vector<hta::Row,std::allocator<hta::Row>>::
      emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::Clock::time_point&,hta::Aggregate&>
                ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)&raw_tvs_local,&current_end,
                 (Aggregate *)local_c0);
      std::chrono::
      time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::operator+=
                (&current_end.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 ,(duration *)&raw_tvs_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Row> convert_timevalues_smooth(const std::vector<TimeValue>& raw_tvs, TimePoint begin,
                                           TimePoint end, Duration interval)
{
    std::vector<Row> rows;
    rows.reserve((end - begin) / interval + 1);
    assert(raw_tvs.size() > 0);
    auto tv_it = raw_tvs.begin();
    auto tv_end = raw_tvs.end();
    auto previous_tp = std::min(begin, tv_it->time);

    for (; tv_it != tv_end && tv_it->time < begin; ++tv_it)
    {
        previous_tp = tv_it->time;
    }
    // Now, at least one is true:
    // 1) tv_it->time >= begin
    // 2) tv_it == tv_end
    // let's exit early to ensure the asserted loop invariant 1)
    // allowing this to return an empty dataset
    if (tv_it == tv_end)
    {
        return rows;
    }

    for (TimePoint current_begin = begin; current_begin < end; current_begin += interval)
    {
        assert(tv_it->time >= current_begin);
        const auto current_end = std::min<TimePoint>(current_begin + interval, end);

        Aggregate agg;
        for (; tv_it != tv_end && tv_it->time < current_end; ++tv_it)
        {
            agg += Aggregate(tv_it->value, tv_it->time - previous_tp);
            previous_tp = tv_it->time;
        }
        if (tv_it == tv_end)
        {
            rows.emplace_back(interval, current_begin, agg);
            return rows;
        }
        // tv_it->time >= next_begin
        auto partial_duration = current_end - previous_tp;
        // WTF clang-format?!
        Aggregate partial_interval{
            tv_it->value,    tv_it->value, 0, 0, tv_it->value * partial_duration.count(),
            partial_duration
        };
        agg += partial_interval;
        previous_tp = current_end;
        rows.emplace_back(interval, current_begin, agg);
    }
    return rows;
}